

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O2

void __thiscall Omega_h::Write<double>::Write(Write<double> *this,HostWrite<double> *host_write)

{
  size_t in_RCX;
  void *in_RDX;
  Write<signed_char> local_20;
  
  HostWrite<double>::write((HostWrite<double> *)&local_20,(int)host_write,in_RDX,in_RCX);
  Write((Write<signed_char> *)this,&local_20);
  ~Write((Write<double> *)&local_20);
  return;
}

Assistant:

Write<T>::Write(HostWrite<T> host_write) : Write<T>(host_write.write()) {}